

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_gettable(lua_State *L,int idx)

{
  TValue *o_00;
  cTValue *local_70;
  cTValue *v;
  cTValue *t;
  int idx_local;
  lua_State *L_local;
  TValue *o;
  
  o_00 = index2adr(L,idx);
  local_70 = lj_meta_tget(L,o_00,L->top + -1);
  if (local_70 == (cTValue *)0x0) {
    L->top = L->top + 2;
    lj_vm_call(L,L->top + -2,2);
    L->top = L->top + -3;
    local_70 = L->top + 2;
  }
  L->top[-1] = *local_70;
  return;
}

Assistant:

LUA_API void lua_gettable(lua_State *L, int idx)
{
  cTValue *t = index2adr_check(L, idx);
  cTValue *v = lj_meta_tget(L, t, L->top-1);
  if (v == NULL) {
    L->top += 2;
    lj_vm_call(L, L->top-2, 1+1);
    L->top -= 2+LJ_FR2;
    v = L->top+1+LJ_FR2;
  }
  copyTV(L, L->top-1, v);
}